

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldAccessor::Set<std::__cxx11::string,std::__cxx11::string>
          (RepeatedFieldAccessor *this,Field *data,int index,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  string local_48 [8];
  ActualType tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  int index_local;
  Field *data_local;
  RepeatedFieldAccessor *this_local;
  
  tmp.field_2._8_8_ = value;
  std::__cxx11::string::string(local_48,(string *)value);
  (**(code **)(*(long *)this + 0x20))(this,data,index,local_48);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void Set(Field* PROTOBUF_NONNULL data, int index,
           const ValueType& value) const {
    typedef typename RefTypeTraits<T>::AccessorValueType ActualType;
    // In this RepeatedFieldAccessor interface we pass/return data using
    // raw pointers. Type of the data these raw pointers point to should
    // be ActualType. Here we have a ValueType object and want a ActualType
    // pointer. We can't cast a ValueType pointer to an ActualType pointer
    // directly because their type might be different (for enums ValueType
    // may be a generated enum type while ActualType is int32_t). To be safe
    // we make a copy to get a temporary ActualType object and use it.
    ActualType tmp = static_cast<ActualType>(value);
    Set(data, index, static_cast<const Value*>(&tmp));
  }